

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

bool libcellml::traverseHierarchyAndRemoveIfEmpty(ComponentPtr *component)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  sVar3 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  while (sVar3 != 0) {
    sVar3 = sVar3 - 1;
    ComponentEntity::component
              ((ComponentEntity *)local_88,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    bVar2 = traverseHierarchyAndRemoveIfEmpty((ComponentPtr *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    if (bVar2) {
      ComponentEntity::removeComponent
                (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_ComponentEntity,sVar3);
    }
  }
  sVar3 = Component::variableCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  sVar4 = Component::resetCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  sVar5 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (((sVar4 + sVar3 != -sVar5) ||
      (Component::math_abi_cxx11_
                 ((string *)local_88,
                  (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr),
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) ||
     (bVar2 = ImportedEntity::isImport
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ImportedEntity), bVar2)) {
    bVar2 = false;
  }
  else {
    NamedEntity::name_abi_cxx11_
              (&local_68,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    if (local_68._M_string_length == 0) {
      Entity::id_abi_cxx11_
                (&local_48,
                 (Entity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      bVar6 = local_48._M_string_length == 0;
      bVar2 = true;
      bVar1 = true;
      goto LAB_002363f3;
    }
    bVar2 = true;
  }
  bVar1 = false;
  bVar6 = false;
LAB_002363f3:
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((sVar4 + sVar3 == -sVar5) &&
     ((element_type *)local_88._0_8_ != (element_type *)(local_88 + 0x10))) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  return bVar6;
}

Assistant:

bool traverseHierarchyAndRemoveIfEmpty(const ComponentPtr &component)
{
    for (size_t i = component->componentCount() - 1; i != MAX_SIZE_T; --i) {
        if (traverseHierarchyAndRemoveIfEmpty(component->component(i))) {
            component->removeComponent(i);
        }
    }

    return (component->variableCount() + component->resetCount() + component->componentCount() == 0)
           && component->math().empty()
           && !component->isImport()
           && component->name().empty()
           && component->id().empty();
}